

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.h
# Opt level: O0

int GetTemperatureP33x(P33X *pP33x,double *pTemperature)

{
  int iVar1;
  float local_24;
  double *pdStack_20;
  float fValue;
  double *pTemperature_local;
  P33X *pP33x_local;
  
  local_24 = 0.0;
  pdStack_20 = pTemperature;
  pTemperature_local = (double *)pP33x;
  iVar1 = ReadChannelP33x(pP33x,'\x04',&local_24);
  if (iVar1 == 0) {
    *pdStack_20 = (double)local_24;
    pTemperature_local[0x65] = *pdStack_20;
  }
  pP33x_local._4_4_ = (uint)(iVar1 != 0);
  return pP33x_local._4_4_;
}

Assistant:

inline int GetTemperatureP33x(P33X* pP33x, double* pTemperature)
{
	float fValue = 0;

	if (ReadChannelP33x(pP33x, TEMPERATURE_CHANNEL_P33X, &fValue) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	*pTemperature = (double)fValue;

	pP33x->LastTemperature = *pTemperature;

	return EXIT_SUCCESS;
}